

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

LogLevel sznet::initLogLevel(void)

{
  LogLevel LVar1;
  char *pcVar2;
  
  pcVar2 = getenv("SZNET_LOG_TRACE");
  LVar1 = TRACE;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv("SZNET_LOG_DEBUG");
    LVar1 = (pcVar2 == (char *)0x0) + DEBUG;
  }
  return LVar1;
}

Assistant:

Logger::LogLevel initLogLevel()
{
	if (::getenv("SZNET_LOG_TRACE"))
	{
		return Logger::TRACE;
	}
	else if (::getenv("SZNET_LOG_DEBUG"))
	{
		return Logger::DEBUG;
	}
	else
	{
		return Logger::INFO;
	}
}